

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::fuzzyCompare(TestLog *log,char *imageSetName,char *imageSetDesc,
                      ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
                      float threshold,CompareLogMode logMode)

{
  ostringstream *this;
  MessageBuilder *pMVar1;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int __fd;
  LogImage *this_00;
  float fVar2;
  FuzzyCompareParams params;
  allocator<char> local_490;
  allocator<char> local_48f;
  allocator<char> local_48e;
  allocator<char> local_48d;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  Vec4 local_488;
  undefined1 local_478 [24];
  undefined1 local_460 [32];
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  ConstPixelBufferAccess local_3c0;
  string local_398;
  string local_378;
  string local_358;
  LogImageSet local_338;
  TextureLevel errorMask;
  LogImage local_2d0;
  LogImage local_240;
  MessageBuilder local_1b0;
  
  params.maxSampleSkip = 8;
  local_1b0.m_log = (TestLog *)0x300000007;
  local_478._16_8_ = imageSetDesc;
  TextureLevel::TextureLevel
            (&errorMask,(TextureFormat *)&local_1b0,(reference->m_size).m_data[0],
             (reference->m_size).m_data[1],1);
  TextureLevel::getAccess((PixelBufferAccess *)&local_1b0,&errorMask);
  pMVar1 = &local_1b0;
  fVar2 = fuzzyCompare(&params,reference,result,(PixelBufferAccess *)pMVar1);
  local_478._0_8_ = (TestLog *)0x0;
  local_478._8_8_ = 0;
  local_488.m_data[0] = 1.0;
  local_488.m_data[1] = 1.0;
  local_488.m_data[2] = 1.0;
  local_488.m_data[3] = 1.0;
  __fd = (int)log;
  if ((logMode == COMPARE_LOG_EVERYTHING) || (threshold < fVar2)) {
    params.maxSampleSkip = 0;
    TextureLevel::getAccess((PixelBufferAccess *)&local_1b0,&errorMask);
    pMVar1 = &local_1b0;
    fuzzyCompare(&params,reference,result,(PixelBufferAccess *)pMVar1);
    if ((((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) &&
       (((reference->m_format).order != RGBA || ((reference->m_format).type != UNORM_INT8)))) {
      pMVar1 = (MessageBuilder *)local_478;
      anon_unknown_50::computeScaleAndBias(reference,result,&local_488,(Vec4 *)pMVar1);
    }
    if (threshold < fVar2) {
      this = &local_1b0.m_str;
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"Image comparison failed: difference = ");
      std::ostream::operator<<(this,fVar2);
      std::operator<<((ostream *)this,", threshold = ");
      std::ostream::operator<<(this,threshold);
      MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_460,imageSetName,&local_489);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,(char *)local_478._16_8_,&local_48a);
    LogImageSet::LogImageSet(&local_338,(string *)local_460,&local_3e0);
    LogImageSet::write(&local_338,__fd,__buf_01,(size_t)pMVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"Result",&local_48b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_460 + 0x40),"Result",&local_48c);
    LogImage::LogImage((LogImage *)&local_1b0,&local_400,(string *)(local_460 + 0x40),result,
                       &local_488,(Vec4 *)local_478,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&local_1b0,__fd,__buf_02,(size_t)result);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_460 + 0x20),"Reference",&local_48d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"Reference",&local_48e);
    LogImage::LogImage(&local_240,(string *)(local_460 + 0x20),&local_358,reference,&local_488,
                       (Vec4 *)local_478,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_240,__fd,__buf_03,(size_t)reference);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"ErrorMask",&local_48f);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"Error mask",&local_490)
    ;
    ConstPixelBufferAccess::ConstPixelBufferAccess(&local_3c0,&errorMask);
    access = &local_3c0;
    LogImage::LogImage(&local_2d0,&local_378,&local_398,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_2d0,__fd,__buf_04,(size_t)access);
    TestLog::endImageSet(log);
    LogImage::~LogImage(&local_2d0);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_378);
    LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)(local_460 + 0x20));
    LogImage::~LogImage((LogImage *)&local_1b0);
    std::__cxx11::string::~string((string *)(local_460 + 0x40));
    std::__cxx11::string::~string((string *)&local_400);
    LogImageSet::~LogImageSet(&local_338);
    std::__cxx11::string::~string((string *)&local_3e0);
    this_00 = (LogImage *)local_460;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_00558984;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_488,(Vec4 *)local_478);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,imageSetName,(allocator<char> *)&local_3e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,(char *)local_478._16_8_,(allocator<char> *)&local_400);
    LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_2d0.m_name,&local_338.m_name);
    LogImageSet::write((LogImageSet *)&local_240,__fd,__buf,(size_t)pMVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"Result",(allocator<char> *)(local_460 + 0x40));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_460,"Result",(allocator<char> *)(local_460 + 0x20));
    LogImage::LogImage((LogImage *)&local_1b0,(string *)&local_3c0,(string *)local_460,result,
                       &local_488,(Vec4 *)local_478,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&local_1b0,__fd,__buf_00,(size_t)result);
    TestLog::endImageSet(log);
    LogImage::~LogImage((LogImage *)&local_1b0);
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)&local_3c0);
    LogImageSet::~LogImageSet((LogImageSet *)&local_240);
    std::__cxx11::string::~string((string *)&local_338);
    this_00 = &local_2d0;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00558984:
  TextureLevel::~TextureLevel(&errorMask);
  return fVar2 <= threshold;
}

Assistant:

bool fuzzyCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, float threshold, CompareLogMode logMode)
{
	FuzzyCompareParams	params;		// Use defaults.
	TextureLevel		errorMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	float				difference		= fuzzyCompare(params, reference, result, errorMask.getAccess());
	bool				isOk			= difference <= threshold;
	Vec4				pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (!isOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// Generate more accurate error mask.
		params.maxSampleSkip = 0;
		fuzzyCompare(params, reference, result, errorMask.getAccess());

		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		if (!isOk)
			log << TestLog::Message << "Image comparison failed: difference = " << difference << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result, pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return isOk;
}